

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_if.hpp
# Opt level: O2

void __thiscall
ranges::
remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:17:10)>_>
::satisfy_forward(remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>
                  *this,iterator_t<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>
                        *it)

{
  reference_wrapper<const_cppti::TalksDB::TalkRef> *prVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar3;
  reference_wrapper<const_cppti::TalksDB::TalkRef> *prVar4;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  prVar1 = (((this->
             super_view_adaptor<ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>,_ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(ranges::cardinality)_1>
             ).rng_.rng_)->
           super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  prVar4 = it->_M_current;
  while ((prVar4 != prVar1 &&
         (sVar2 = (this->
                  super_box<ranges::semiregular_box<ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>,_void,_(ranges::detail::box_compress)0>
                  ).value.field_0.data_.pred_.conference._M_len, sVar2 != 0))) {
    __x._M_len = (prVar4->_M_data->conference)._M_len;
    __x._M_str = (prVar4->_M_data->conference)._M_str;
    __y._M_str = (this->
                 super_box<ranges::semiregular_box<ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>,_void,_(ranges::detail::box_compress)0>
                 ).value.field_0.data_.pred_.conference._M_str;
    __y._M_len = sVar2;
    bVar3 = std::operator==(__x,__y);
    if (bVar3) {
      return;
    }
    prVar4 = it->_M_current + 1;
    it->_M_current = prVar4;
  }
  return;
}

Assistant:

constexpr void satisfy_forward(iterator_t<Rng> & it)
        {
            auto const last = ranges::end(this->base());
            auto & pred = this->remove_if_view::box::get();
            while(it != last && invoke(pred, *it))
                ++it;
        }